

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tl.cpp
# Opt level: O0

void __thiscall pg::TLSolver::attractVertices(TLSolver *this,int pl,int v,bitset *R,bitset *Z)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  _label_vertex _Var4;
  int local_e4;
  _label_vertex local_c8;
  Game *local_b8;
  int local_b0;
  _label_vertex local_a8;
  undefined1 local_98 [16];
  int *local_78;
  int *curedge_1;
  undefined1 local_68 [4];
  uint e;
  undefined1 local_58 [28];
  int from;
  int *curedge;
  bitset *Z_local;
  bitset *R_local;
  int v_local;
  int pl_local;
  TLSolver *this_local;
  uintqueue *local_10;
  
  curedge = (int *)Z;
  Z_local = R;
  R_local._0_4_ = v;
  R_local._4_4_ = pl;
  _v_local = this;
  register0x00000000 = (uint *)Solver::ins(&this->super_Solver,v);
  do {
    if (*stack0xffffffffffffffc0 == 0xffffffff) {
      return;
    }
    local_58._20_4_ = *stack0xffffffffffffffc0;
    bitset::operator[]((bitset *)local_58,(size_t)curedge);
    bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_58);
    if (bVar1) {
      iVar2 = Solver::owner(&this->super_Solver,local_58._20_4_);
      if ((iVar2 == R_local._4_4_) && (this->str[(int)local_58._20_4_] == -1)) {
        this->str[(int)local_58._20_4_] = (int)R_local;
      }
    }
    else {
      bitset::operator[]((bitset *)local_68,(size_t)Z_local);
      bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_68);
      if (bVar1) {
        iVar2 = Solver::owner(&this->super_Solver,local_58._20_4_);
        if (iVar2 != R_local._4_4_) {
          curedge_1._4_4_ = this->escs[(int)local_58._20_4_];
          if (curedge_1._4_4_ == 0) {
            for (local_78 = Solver::outs(&this->super_Solver,local_58._20_4_); *local_78 != -1;
                local_78 = local_78 + 1) {
              bitset::operator[]((bitset *)&stack0xffffffffffffff78,(size_t)&this->G);
              bVar1 = bitset::reference::operator_cast_to_bool
                                ((reference *)&stack0xffffffffffffff78);
              if (bVar1) {
                curedge_1._4_4_ = curedge_1._4_4_ + 1;
              }
            }
          }
          curedge_1._4_4_ = curedge_1._4_4_ - 1;
          this->escs[(int)local_58._20_4_] = curedge_1._4_4_;
          if (curedge_1._4_4_ != 0) goto LAB_00229010;
        }
        bitset::operator[]((bitset *)local_98,(size_t)curedge);
        bitset::reference::operator=((reference *)local_98,true);
        iVar2 = Solver::owner(&this->super_Solver,local_58._20_4_);
        if (iVar2 == R_local._4_4_) {
          local_e4 = (int)R_local;
        }
        else {
          local_e4 = -1;
        }
        this->str[(int)local_58._20_4_] = local_e4;
        local_10 = &this->Q;
        this_local._4_4_ = local_58._20_4_;
        iVar2 = (this->Q).pointer;
        (this->Q).pointer = iVar2 + 1;
        local_10->queue[iVar2] = local_58._20_4_;
        if (2 < (this->super_Solver).trace) {
          poVar3 = std::operator<<((this->super_Solver).logger,"\x1b[1;37mattracted \x1b[36m");
          _Var4 = Solver::label_vertex(&this->super_Solver,local_58._20_4_);
          local_b8 = _Var4.g;
          local_b0 = _Var4.v;
          local_a8.g = local_b8;
          local_a8.v = local_b0;
          poVar3 = operator<<(poVar3,&local_a8);
          poVar3 = std::operator<<(poVar3,"\x1b[m by \x1b[1;36m");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,R_local._4_4_);
          std::operator<<(poVar3,"\x1b[m");
          iVar2 = Solver::owner(&this->super_Solver,local_58._20_4_);
          if (iVar2 == R_local._4_4_) {
            poVar3 = std::operator<<((this->super_Solver).logger," (via ");
            _Var4 = Solver::label_vertex(&this->super_Solver,(int)R_local);
            local_c8.g = _Var4.g;
            local_c8.v = _Var4.v;
            poVar3 = operator<<(poVar3,&local_c8);
            poVar3 = std::operator<<(poVar3,")");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          }
          else {
            poVar3 = std::operator<<((this->super_Solver).logger," (forced)");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          }
        }
      }
    }
LAB_00229010:
    register0x00000000 = stack0xffffffffffffffc0 + 1;
  } while( true );
}

Assistant:

void
TLSolver::attractVertices(const int pl, const int v, bitset &R, bitset &Z)
{
    // attract vertices with an edge to <v>
    for (auto curedge = ins(v); *curedge != -1; curedge++) {
        int from = *curedge;
        if (Z[from]) {
            // already in Z, maybe set strategy (for vertices in the original target set)
            if (owner(from) == pl and str[from] == -1) str[from] = v;
        } else if (R[from]) {
            if (owner(from) != pl) {
                // check if opponent can escape
                unsigned int e = escs[from];
                if (e == 0) {
                    for (auto curedge = outs(from); *curedge != -1; curedge++) {
                        if (G[*curedge]) e++;
                    }
                }
                escs[from] = --e;
                if (e > 0) continue; // escapes
            }
            // attract
            Z[from] = true;
            str[from] = owner(from) == pl ? v : -1;
            Q.push(from);
#ifndef NDEBUG
            // maybe report event
            if (trace >= 3) {
                logger << "\033[1;37mattracted \033[36m" << label_vertex(from) << "\033[m by \033[1;36m" << pl << "\033[m";
                if (owner(from) == pl) logger << " (via " << label_vertex(v) << ")" << std::endl;
                else logger << " (forced)" << std::endl;
            }
#endif
        }
    }
}